

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.hpp
# Opt level: O0

void __thiscall
boost::deflate::detail::deflate_stream::send_bits(deflate_stream *this,int value,int length)

{
  int length_local;
  int value_local;
  deflate_stream *this_local;
  
  if (0x10 - length < this->bi_valid_) {
    this->bi_buf_ = this->bi_buf_ | (ushort)((value & 0xffffU) << ((byte)this->bi_valid_ & 0x1f));
    put_short(this,this->bi_buf_);
    this->bi_buf_ = (uint16_t)((int)(value & 0xffffU) >> (0x10U - (char)this->bi_valid_ & 0x1f));
    this->bi_valid_ = length + -0x10 + this->bi_valid_;
  }
  else {
    this->bi_buf_ = this->bi_buf_ | (ushort)((value & 0xffffU) << ((byte)this->bi_valid_ & 0x1f));
    this->bi_valid_ = length + this->bi_valid_;
  }
  return;
}

Assistant:

void
    send_bits(int value, int length)
    {
        if(bi_valid_ > (int)buf_size - length)
        {
            bi_buf_ |= (std::uint16_t)value << bi_valid_;
            put_short(bi_buf_);
            bi_buf_ = (std::uint16_t)value >> (buf_size - bi_valid_);
            bi_valid_ += length - buf_size;
        }
        else
        {
            bi_buf_ |= (std::uint16_t)(value) << bi_valid_;
            bi_valid_ += length;
        }
    }